

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

uint32_t FAudioFXReverb_LockForProcess
                   (FAudioFXReverb *fapo,uint32_t InputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pInputLockedParameters,
                   uint32_t OutputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pOutputLockedParameters)

{
  int8_t iVar1;
  uint32_t in_ECX;
  FAPOLockForProcessBufferParameters *in_RDX;
  uint32_t in_ESI;
  FAPOBase *in_RDI;
  FAPOLockForProcessBufferParameters *in_R8;
  int32_t unaff_retaddr;
  undefined4 in_stack_00000010;
  FAudioWaveFormatEx *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint32_t uVar2;
  
  iVar1 = IsFloatFormat(in_stack_ffffffffffffffc8);
  if (iVar1 == '\0') {
    uVar2 = 0x88970001;
  }
  else if ((in_RDX->pFormat->nSamplesPerSec < 20000) || (48000 < in_RDX->pFormat->nSamplesPerSec)) {
    uVar2 = 0x88970001;
  }
  else if ((((in_RDX->pFormat->nChannels == 1) &&
            ((in_R8->pFormat->nChannels == 1 || (in_R8->pFormat->nChannels == 6)))) ||
           ((in_RDX->pFormat->nChannels == 2 &&
            ((in_R8->pFormat->nChannels == 2 || (in_R8->pFormat->nChannels == 6)))))) ||
          ((in_RDX->pFormat->nChannels == 6 && (in_R8->pFormat->nChannels == 6)))) {
    *(uint16_t *)&in_RDI[1].base.AddRef = in_RDX->pFormat->nChannels;
    *(uint16_t *)((long)&in_RDI[1].base.AddRef + 2) = in_R8->pFormat->nChannels;
    *(uint32_t *)((long)&in_RDI[1].base.AddRef + 4) = in_R8->pFormat->nSamplesPerSec;
    *(uint16_t *)&in_RDI[1].base.Release = in_RDX->pFormat->nBlockAlign;
    *(uint16_t *)((long)&in_RDI[1].base.Release + 2) = in_R8->pFormat->nBlockAlign;
    DspReverb_Create((DspReverb *)CONCAT44(OutputLockedParameterCount,in_stack_00000010),
                     pOutputLockedParameters._4_4_,(int32_t)pOutputLockedParameters,unaff_retaddr,
                     (FAudioMallocFunc)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                    );
    uVar2 = FAPOBase_LockForProcess(in_RDI,in_ESI,in_RDX,in_ECX,in_R8);
  }
  else {
    uVar2 = 0x88970001;
  }
  return uVar2;
}

Assistant:

uint32_t FAudioFXReverb_LockForProcess(
	FAudioFXReverb *fapo,
	uint32_t InputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pInputLockedParameters,
	uint32_t OutputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pOutputLockedParameters
) {
	/* Reverb specific validation */
	if (!IsFloatFormat(pInputLockedParameters->pFormat))
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	if (	pInputLockedParameters->pFormat->nSamplesPerSec < FAUDIOFX_REVERB_MIN_FRAMERATE ||
		pInputLockedParameters->pFormat->nSamplesPerSec > FAUDIOFX_REVERB_MAX_FRAMERATE	)
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	if (!(	(pInputLockedParameters->pFormat->nChannels == 1 &&
			(pOutputLockedParameters->pFormat->nChannels == 1 ||
			 pOutputLockedParameters->pFormat->nChannels == 6)) ||
		(pInputLockedParameters->pFormat->nChannels == 2 &&
			(pOutputLockedParameters->pFormat->nChannels == 2 ||
			 pOutputLockedParameters->pFormat->nChannels == 6)) ||
		(pInputLockedParameters->pFormat->nChannels == 6 &&
			pOutputLockedParameters->pFormat->nChannels == 6)))
	{
		return FAPO_E_FORMAT_UNSUPPORTED;
	}

	/* Save the things we care about */
	fapo->inChannels = pInputLockedParameters->pFormat->nChannels;
	fapo->outChannels = pOutputLockedParameters->pFormat->nChannels;
	fapo->sampleRate = pOutputLockedParameters->pFormat->nSamplesPerSec;
	fapo->inBlockAlign = pInputLockedParameters->pFormat->nBlockAlign;
	fapo->outBlockAlign = pOutputLockedParameters->pFormat->nBlockAlign;

	/* Create the network */
	DspReverb_Create(
		&fapo->reverb,
		fapo->sampleRate,
		fapo->inChannels,
		fapo->outChannels,
		fapo->base.pMalloc
	);

	/* Call	parent to do basic validation */
	return FAPOBase_LockForProcess(
		&fapo->base,
		InputLockedParameterCount,
		pInputLockedParameters,
		OutputLockedParameterCount,
		pOutputLockedParameters
	);
}